

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createSphere(BulletEngine *this,aphy_scalar radius)

{
  btSphereShape *this_00;
  Counter *pCVar1;
  btSphereShape *in_stack_ffffffffffffffb8;
  ref<aphy::collision_shape> *this_01;
  undefined8 in_stack_ffffffffffffffc8;
  btScalar radius_00;
  ref<aphy::collision_shape> local_18 [3];
  
  radius_00 = (btScalar)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  this_00 = (btSphereShape *)btSphereShape::operator_new(0x1288f9);
  btSphereShape::btSphereShape(this_00,radius_00);
  this_01 = local_18;
  aphy::makeObject<APhyBullet::BulletCollisionShape,btSphereShape*>(in_stack_ffffffffffffffb8);
  pCVar1 = aphy::ref<aphy::collision_shape>::disown(this_01);
  aphy::ref<aphy::collision_shape>::~ref(this_01);
  return pCVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createSphere(aphy_scalar radius)
{
    return makeObject<BulletCollisionShape> (
        new btSphereShape(radius)
    ).disown();
}